

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer-a3.cpp
# Opt level: O3

void __thiscall
RasterizerA3<4u>::_renderImpl<CompositorScalar,false>(RasterizerA3<4u> *this,uint32_t argb32)

{
  ulong uVar1;
  uint uVar2;
  long lVar3;
  undefined1 auVar4 [16];
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  ulong *puVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  uint uVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  undefined1 in_XMM0 [16];
  undefined1 auVar27 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  long local_80;
  long local_68;
  
  auVar4 = _DAT_001144d0;
  uVar21 = (ulong)(int)*(uint *)(this + 0x40);
  uVar2 = *(uint *)(this + 0x44);
  if (*(uint *)(this + 0x40) <= uVar2) {
    lVar3 = *(long *)(*(long *)(this + 8) + 8);
    iVar15 = (argb32 & 0xff00ff) * (argb32 >> 0x18);
    iVar9 = (argb32 >> 8 & 0xff | 0xff0000) * (argb32 >> 0x18);
    uVar16 = (iVar9 + 0x800080U >> 8 & 0xff00ff) + iVar9 + 0x800080;
    uVar11 = (iVar15 + 0x800080U >> 8 & 0xff00ff) + iVar15 + 0x800080 >> 8 & 0xff00ff;
    uVar14 = uVar16 & 0xff00ff00 | uVar11;
    lVar7 = *(long *)(*(long *)(this + 8) + 0x10);
    lVar25 = lVar7 + lVar3 * uVar21;
    lVar26 = *(long *)(this + 0x58) * uVar21 * 8 + *(long *)(this + 0x60);
    puVar12 = (ulong *)(*(long *)(this + 0x48) * uVar21 * 8 + *(long *)(this + 0x50));
    uVar16 = uVar16 >> 8 & 0xff00ff;
    local_80 = lVar7 + lVar3 * uVar21 + 0xc;
    auVar27 = pmovsxbq(in_XMM0,0x302);
    auVar28 = pmovsxbq(in_XMM1,0x100);
    do {
      lVar7 = *(long *)(this + 0x48);
      local_68 = 3;
      uVar19 = 0;
      uVar24 = 0;
      uVar8 = 0;
      do {
        uVar18 = *puVar12;
        *puVar12 = 0;
        uVar1 = uVar8 + 0x100;
        while (uVar18 != 0) {
          lVar22 = 0;
          if (uVar18 != 0) {
            for (; (uVar18 >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
            }
          }
          uVar13 = -1L << ((byte)lVar22 & 0x3f);
          uVar10 = (ulong)(uint)((int)lVar22 << 2);
          uVar5 = uVar10 | uVar8;
          uVar6 = uVar24;
          if (uVar24 < uVar5) {
            uVar20 = uVar19 & 0x1ff;
            uVar23 = uVar20 ^ 0x1ff;
            if (uVar20 < 0x100) {
              uVar23 = uVar20;
            }
            uVar6 = uVar5;
            if (uVar23 != 0) {
              if (uVar23 == 0xff) {
                lVar22 = ~uVar24 + (uVar10 | uVar8);
                auVar31._8_4_ = (int)lVar22;
                auVar31._0_8_ = lVar22;
                auVar31._12_4_ = (int)((ulong)lVar22 >> 0x20);
                lVar22 = local_80 + uVar24 * 4;
                uVar5 = 0;
                do {
                  auVar29._8_4_ = (int)uVar5;
                  auVar29._0_8_ = uVar5;
                  auVar29._12_4_ = (int)(uVar5 >> 0x20);
                  auVar30 = auVar31 ^ auVar4;
                  auVar32 = (auVar29 | auVar28) ^ auVar4;
                  iVar9 = auVar30._4_4_;
                  if ((bool)(~(iVar9 < auVar32._4_4_ ||
                              auVar30._0_4_ < auVar32._0_4_ && auVar32._4_4_ == iVar9) & 1)) {
                    *(uint *)(lVar22 + -0xc + uVar5 * 4) = uVar14;
                  }
                  if (auVar32._12_4_ <= auVar30._12_4_ &&
                      (auVar32._8_4_ <= auVar30._8_4_ || auVar32._12_4_ != auVar30._12_4_)) {
                    *(uint *)(lVar22 + -8 + uVar5 * 4) = uVar14;
                  }
                  auVar29 = (auVar29 | auVar27) ^ auVar4;
                  iVar15 = auVar29._4_4_;
                  if (iVar15 <= iVar9 && (iVar15 != iVar9 || auVar29._0_4_ <= auVar30._0_4_)) {
                    *(uint *)(lVar22 + -4 + uVar5 * 4) = uVar14;
                    *(uint *)(lVar22 + uVar5 * 4) = uVar14;
                  }
                  uVar5 = uVar5 + 4;
                } while (((local_68 + uVar10) - uVar24 & 0xfffffffffffffffc) != uVar5);
              }
              else {
                do {
                  uVar20 = *(uint *)(lVar25 + uVar24 * 4);
                  uVar17 = (uVar20 & 0xff00ff) * (0xff - uVar23) + uVar23 * uVar11 + 0x800080;
                  uVar20 = (uVar20 >> 8 & 0xff00ff) * (0xff - uVar23) + uVar23 * uVar16 + 0x800080;
                  *(uint *)(lVar25 + uVar24 * 4) =
                       (uVar17 >> 8 & 0xff00ff) + uVar17 >> 8 & 0xff00ff |
                       (uVar20 >> 8 & 0xff00ff) + uVar20 & 0xff00ff00;
                  uVar24 = uVar24 + 1;
                } while (uVar24 < uVar5);
              }
            }
          }
          if (uVar18 == uVar13) {
            uVar24 = (long)*(int *)(this + 0x30);
            if (uVar1 < (ulong)(long)*(int *)(this + 0x30)) {
              uVar24 = uVar1;
            }
            uVar18 = 0;
          }
          else {
            uVar13 = uVar13 ^ uVar18;
            lVar22 = 0;
            if (uVar13 != 0) {
              for (; (uVar13 >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
              }
            }
            uVar18 = -1L << ((byte)lVar22 & 0x3f) ^ uVar13;
            uVar24 = (uint)((int)lVar22 << 2) | uVar8;
          }
          if (uVar6 < uVar24) {
            do {
              uVar19 = uVar19 + *(int *)(lVar26 + uVar6 * 8);
              uVar20 = uVar19 - (*(uint *)(lVar26 + 4 + uVar6 * 8) >> 9) & 0x1ff;
              uVar23 = uVar20 ^ 0x1ff;
              if (uVar20 < 0x100) {
                uVar23 = uVar20;
              }
              *(undefined8 *)(lVar26 + uVar6 * 8) = 0;
              uVar20 = uVar14;
              if (uVar23 != 0xff) {
                uVar20 = *(uint *)(lVar25 + uVar6 * 4);
                iVar15 = uVar23 * uVar11 + (uVar20 & 0xff00ff) * (0xff - uVar23);
                iVar9 = uVar23 * uVar16 + (0xff - uVar23) * (uVar20 >> 8 & 0xff00ff);
                uVar20 = (iVar15 + 0x800080U >> 8 & 0xff00ff) + iVar15 + 0x800080 >> 8 & 0xff00ff |
                         iVar9 + (iVar9 + 0x800080U >> 8 & 0xff00ff) + 0x800080 & 0xff00ff00;
              }
              *(uint *)(lVar25 + uVar6 * 4) = uVar20;
              uVar6 = uVar6 + 1;
            } while (uVar24 != uVar6);
          }
        }
        puVar12 = puVar12 + 1;
        local_68 = local_68 + 0x100;
        lVar7 = lVar7 + -1;
        uVar8 = uVar1;
      } while (lVar7 != 0);
      uVar8 = (ulong)*(int *)(this + 0x30);
      lVar7 = uVar8 - uVar24;
      if (uVar24 <= uVar8 && lVar7 != 0) {
        uVar19 = uVar19 & 0x1ff;
        uVar23 = uVar19 ^ 0x1ff;
        if (uVar19 < 0x100) {
          uVar23 = uVar19;
        }
        if (uVar23 != 0) {
          if (uVar23 == 0xff) {
            lVar22 = lVar7 + -1;
            auVar30._8_4_ = (int)lVar22;
            auVar30._0_8_ = lVar22;
            auVar30._12_4_ = (int)((ulong)lVar22 >> 0x20);
            lVar22 = local_80 + uVar24 * 4;
            auVar30 = auVar30 ^ auVar4;
            uVar8 = 0;
            do {
              auVar32._8_4_ = (int)uVar8;
              auVar32._0_8_ = uVar8;
              auVar32._12_4_ = (int)(uVar8 >> 0x20);
              auVar31 = (auVar32 | auVar28) ^ auVar4;
              iVar9 = auVar30._4_4_;
              if ((bool)(~(iVar9 < auVar31._4_4_ ||
                          auVar30._0_4_ < auVar31._0_4_ && auVar31._4_4_ == iVar9) & 1)) {
                *(uint *)(lVar22 + -0xc + uVar8 * 4) = uVar14;
              }
              if (auVar31._12_4_ <= auVar30._12_4_ &&
                  (auVar31._8_4_ <= auVar30._8_4_ || auVar31._12_4_ != auVar30._12_4_)) {
                *(uint *)(lVar22 + -8 + uVar8 * 4) = uVar14;
              }
              auVar31 = (auVar32 | auVar27) ^ auVar4;
              iVar15 = auVar31._4_4_;
              if (iVar15 <= iVar9 && (iVar15 != iVar9 || auVar31._0_4_ <= auVar30._0_4_)) {
                *(uint *)(lVar22 + -4 + uVar8 * 4) = uVar14;
                *(uint *)(lVar22 + uVar8 * 4) = uVar14;
              }
              uVar8 = uVar8 + 4;
            } while ((lVar7 + 3U & 0xfffffffffffffffc) != uVar8);
          }
          else {
            do {
              uVar19 = *(uint *)(lVar25 + uVar24 * 4);
              uVar20 = (uVar19 & 0xff00ff) * (0xff - uVar23) + uVar23 * uVar11 + 0x800080;
              uVar19 = (uVar19 >> 8 & 0xff00ff) * (0xff - uVar23) + uVar23 * uVar16 + 0x800080;
              *(uint *)(lVar25 + uVar24 * 4) =
                   (uVar20 >> 8 & 0xff00ff) + uVar20 >> 8 & 0xff00ff |
                   (uVar19 >> 8 & 0xff00ff) + uVar19 & 0xff00ff00;
              uVar24 = uVar24 + 1;
            } while (uVar8 != uVar24);
          }
        }
      }
      lVar25 = lVar25 + lVar3;
      lVar26 = lVar26 + *(long *)(this + 0x58) * 8;
      uVar21 = uVar21 + 1;
      local_80 = local_80 + lVar3;
    } while (uVar21 <= (ulong)(long)(int)uVar2);
  }
  *(undefined8 *)(this + 0x40) = 0x7fffffff;
  return;
}

Assistant:

inline void RasterizerA3<N>::_renderImpl(uint32_t argb32) noexcept {
  uint8_t* dstLine = _dst->data();
  intptr_t dstStride = _dst->stride();

  size_t y0 = size_t(_yBounds.start);
  size_t y1 = size_t(_yBounds.end);

  BitWord* bitPtr = _bits + y0 * _bitStride;
  Cell* cellLine = _cells + y0 * _cellStride;

  Compositor compositor(argb32);
  dstLine += y0 * dstStride;

  while (y0 <= y1) {
    size_t nBits = size_t(_bitStride);

    Cell* cell = cellLine;
    uint32_t* dstPix = reinterpret_cast<uint32_t*>(dstLine);

    int cover = 0;
    size_t x0 = 0;
    size_t xOffset = 0;

    do {
      IntUtils::BitWordFlipIterator<BitWord> it(*bitPtr);
      *bitPtr = 0;

      while (it.hasNext()) {
        size_t x1 = xOffset + it.nextAndFlip() * kPixelsPerOneBit;
        if (x0 < x1) {
          uint32_t mask = CompositeUtils::calcMask<NonZero>(cover);
          if (mask)
            compositor.cmask(dstPix, x0, x1, mask);
          x0 = x1;
        }

        if (it.hasNext())
          x1 = xOffset + it.nextAndFlip() * kPixelsPerOneBit;
        else
          x1 = std::min<size_t>(_width, xOffset + kPixelsPerBitWord);

        compositor.template vmask<NonZero>(dstPix, x0, x1, cell, cover);
        x0 = x1;
      }

      xOffset += kPixelsPerBitWord;
      bitPtr++;
    } while (--nBits);

    if (x0 < _width) {
      uint32_t mask = CompositeUtils::calcMask<NonZero>(cover);
      if (mask)
        compositor.cmask(dstPix, x0, _width, mask);
    }

    dstLine += dstStride;
    cellLine += _cellStride;
    y0++;
  }

  _yBounds.reset();
}